

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1630bd::ThrowingErrorReporter::addError
          (ThrowingErrorReporter *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  char *pcVar1;
  size_t sVar2;
  Fault f;
  char (*in_stack_ffffffffffffffb0) [3];
  String local_48;
  Fault local_28;
  uint32_t local_20;
  uint32_t local_1c;
  char *local_18;
  size_t local_10;
  
  local_10 = message.content.size_;
  local_18 = message.content.ptr;
  local_20 = endByte;
  local_1c = startByte;
  kj::
  str<kj::StringPtr&,char_const(&)[3],unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
            (&local_48,(kj *)&local_18,(StringPtr *)" (",(char (*) [3])&local_1c,(uint *)0x2792eb,
             (char (*) [2])&local_20,(uint *)0x2528fc,in_stack_ffffffffffffffb0);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::String>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
             ,0x26,FAILED,(char *)0x0,"kj::str(message, \" (\", startByte, \":\", endByte, \").\")",
             &local_48);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    KJ_FAIL_REQUIRE(kj::str(message, " (", startByte, ":", endByte, ")."));
  }